

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomGradient::read(DomGradient *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  bool bVar1;
  int iVar2;
  size_t __nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  QLatin1String *size;
  long in_FS_OFFSET;
  double dVar3;
  DomGradientStop *v;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  QXmlStreamAttributes *attributes;
  QStringView tag;
  QStringView name;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_type in_stack_fffffffffffffb68;
  DomGradient *in_stack_fffffffffffffb70;
  QLatin1String *a;
  DomGradientStop *in_stack_fffffffffffffb78;
  uint in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  QLatin1String *in_stack_fffffffffffffb88;
  uint in_stack_fffffffffffffb90;
  byte in_stack_fffffffffffffb94;
  byte in_stack_fffffffffffffb95;
  byte in_stack_fffffffffffffb96;
  byte in_stack_fffffffffffffb97;
  byte in_stack_fffffffffffffb98;
  byte in_stack_fffffffffffffb99;
  byte in_stack_fffffffffffffb9a;
  byte in_stack_fffffffffffffb9b;
  byte in_stack_fffffffffffffb9c;
  byte in_stack_fffffffffffffb9d;
  byte in_stack_fffffffffffffb9e;
  byte in_stack_fffffffffffffb9f;
  QStringView local_278 [3];
  QStringView local_240 [3];
  QStringView local_208 [3];
  QStringView local_1d0 [3];
  QStringView local_198 [3];
  QStringView local_160 [3];
  QStringView local_128 [3];
  QStringView local_f0 [3];
  QStringView local_b8 [3];
  QStringView local_80 [3];
  QStringView local_48;
  QXmlStreamAttribute *local_38;
  const_iterator local_30;
  const_iterator local_28 [4];
  long local_8;
  
  size = (QLatin1String *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  local_28[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffb70);
  local_30.i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_30 = QList<QXmlStreamAttribute>::end
                       ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffb70);
  while( true ) {
    local_38 = local_30.i;
    bVar1 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_28,local_30);
    if (!bVar1) break;
    QList<QXmlStreamAttribute>::const_iterator::operator*(local_28);
    local_48.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
    local_48.m_size = 0xaaaaaaaaaaaaaaaa;
    local_48 = QXmlStreamAttribute::name((QXmlStreamAttribute *)0x1b37b0);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffb88,
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
    QStringView::QStringView<QString,_true>
              ((QStringView *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (QString *)in_stack_fffffffffffffb78);
    in_stack_fffffffffffffb9f =
         ::operator==((QStringView *)in_stack_fffffffffffffb70,
                      (QStringView *)in_stack_fffffffffffffb68);
    QString::~QString((QString *)0x1b3814);
    if ((in_stack_fffffffffffffb9f & 1) == 0) {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffb88,
                 CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      QStringView::QStringView<QString,_true>
                ((QStringView *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                 (QString *)in_stack_fffffffffffffb78);
      in_stack_fffffffffffffb9e =
           ::operator==((QStringView *)in_stack_fffffffffffffb70,
                        (QStringView *)in_stack_fffffffffffffb68);
      QString::~QString((QString *)0x1b38ac);
      if ((in_stack_fffffffffffffb9e & 1) == 0) {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)in_stack_fffffffffffffb88,
                   CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
        QStringView::QStringView<QString,_true>
                  ((QStringView *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                   (QString *)in_stack_fffffffffffffb78);
        in_stack_fffffffffffffb9d =
             ::operator==((QStringView *)in_stack_fffffffffffffb70,
                          (QStringView *)in_stack_fffffffffffffb68);
        QString::~QString((QString *)0x1b3944);
        if ((in_stack_fffffffffffffb9d & 1) == 0) {
          Qt::Literals::StringLiterals::operator____s
                    ((char16_t *)in_stack_fffffffffffffb88,
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
          QStringView::QStringView<QString,_true>
                    ((QStringView *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     (QString *)in_stack_fffffffffffffb78);
          in_stack_fffffffffffffb9c =
               ::operator==((QStringView *)in_stack_fffffffffffffb70,
                            (QStringView *)in_stack_fffffffffffffb68);
          QString::~QString((QString *)0x1b39dc);
          if ((in_stack_fffffffffffffb9c & 1) == 0) {
            Qt::Literals::StringLiterals::operator____s
                      ((char16_t *)in_stack_fffffffffffffb88,
                       CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
            QStringView::QStringView<QString,_true>
                      ((QStringView *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                       (QString *)in_stack_fffffffffffffb78);
            in_stack_fffffffffffffb9b =
                 ::operator==((QStringView *)in_stack_fffffffffffffb70,
                              (QStringView *)in_stack_fffffffffffffb68);
            QString::~QString((QString *)0x1b3a74);
            if ((in_stack_fffffffffffffb9b & 1) == 0) {
              Qt::Literals::StringLiterals::operator____s
                        ((char16_t *)in_stack_fffffffffffffb88,
                         CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
              QStringView::QStringView<QString,_true>
                        ((QStringView *)
                         CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                         (QString *)in_stack_fffffffffffffb78);
              in_stack_fffffffffffffb9a =
                   ::operator==((QStringView *)in_stack_fffffffffffffb70,
                                (QStringView *)in_stack_fffffffffffffb68);
              QString::~QString((QString *)0x1b3b0c);
              if ((in_stack_fffffffffffffb9a & 1) == 0) {
                Qt::Literals::StringLiterals::operator____s
                          ((char16_t *)in_stack_fffffffffffffb88,
                           CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
                QStringView::QStringView<QString,_true>
                          ((QStringView *)
                           CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                           (QString *)in_stack_fffffffffffffb78);
                in_stack_fffffffffffffb99 =
                     ::operator==((QStringView *)in_stack_fffffffffffffb70,
                                  (QStringView *)in_stack_fffffffffffffb68);
                QString::~QString((QString *)0x1b3ba4);
                if ((in_stack_fffffffffffffb99 & 1) == 0) {
                  Qt::Literals::StringLiterals::operator____s
                            ((char16_t *)in_stack_fffffffffffffb88,
                             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
                  QStringView::QStringView<QString,_true>
                            ((QStringView *)
                             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                             (QString *)in_stack_fffffffffffffb78);
                  in_stack_fffffffffffffb98 =
                       ::operator==((QStringView *)in_stack_fffffffffffffb70,
                                    (QStringView *)in_stack_fffffffffffffb68);
                  QString::~QString((QString *)0x1b3c3c);
                  if ((in_stack_fffffffffffffb98 & 1) == 0) {
                    Qt::Literals::StringLiterals::operator____s
                              ((char16_t *)in_stack_fffffffffffffb88,
                               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
                    QStringView::QStringView<QString,_true>
                              ((QStringView *)
                               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                               (QString *)in_stack_fffffffffffffb78);
                    in_stack_fffffffffffffb97 =
                         ::operator==((QStringView *)in_stack_fffffffffffffb70,
                                      (QStringView *)in_stack_fffffffffffffb68);
                    QString::~QString((QString *)0x1b3cd4);
                    if ((in_stack_fffffffffffffb97 & 1) == 0) {
                      Qt::Literals::StringLiterals::operator____s
                                ((char16_t *)in_stack_fffffffffffffb88,
                                 CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
                      QStringView::QStringView<QString,_true>
                                ((QStringView *)
                                 CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                                 (QString *)in_stack_fffffffffffffb78);
                      in_stack_fffffffffffffb96 =
                           ::operator==((QStringView *)in_stack_fffffffffffffb70,
                                        (QStringView *)in_stack_fffffffffffffb68);
                      QString::~QString((QString *)0x1b3d6c);
                      if ((in_stack_fffffffffffffb96 & 1) == 0) {
                        Qt::Literals::StringLiterals::operator____s
                                  ((char16_t *)in_stack_fffffffffffffb88,
                                   CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
                        QStringView::QStringView<QString,_true>
                                  ((QStringView *)
                                   CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                                   (QString *)in_stack_fffffffffffffb78);
                        in_stack_fffffffffffffb95 =
                             ::operator==((QStringView *)in_stack_fffffffffffffb70,
                                          (QStringView *)in_stack_fffffffffffffb68);
                        QString::~QString((QString *)0x1b3e04);
                        if ((in_stack_fffffffffffffb95 & 1) == 0) {
                          Qt::Literals::StringLiterals::operator____s
                                    ((char16_t *)in_stack_fffffffffffffb88,
                                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
                          QStringView::QStringView<QString,_true>
                                    ((QStringView *)
                                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                                     (QString *)in_stack_fffffffffffffb78);
                          in_stack_fffffffffffffb94 =
                               ::operator==((QStringView *)in_stack_fffffffffffffb70,
                                            (QStringView *)in_stack_fffffffffffffb68);
                          QString::~QString((QString *)0x1b3eb5);
                          if ((in_stack_fffffffffffffb94 & 1) == 0) {
                            Qt::Literals::StringLiterals::operator____s
                                      ((char16_t *)in_stack_fffffffffffffb88,
                                       CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80)
                                      );
                            QStringView::QStringView<QString,_true>
                                      ((QStringView *)
                                       CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80)
                                       ,(QString *)in_stack_fffffffffffffb78);
                            bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffb70,
                                                 (QStringView *)in_stack_fffffffffffffb68);
                            in_stack_fffffffffffffb90 =
                                 CONCAT13(bVar1,(int3)in_stack_fffffffffffffb90);
                            QString::~QString((QString *)0x1b3f66);
                            if ((in_stack_fffffffffffffb90 & 0x1000000) == 0) {
                              in_stack_fffffffffffffb88 = size;
                              Qt::Literals::StringLiterals::operator____L1
                                        ((char *)in_stack_fffffffffffffb78,
                                         (size_t)in_stack_fffffffffffffb70);
                              ::operator+((QLatin1String *)in_stack_fffffffffffffb70,
                                          (QStringView *)in_stack_fffffffffffffb68);
                              ::QStringBuilder::operator_cast_to_QString
                                        ((QStringBuilder<QLatin1String,_const_QStringView_&> *)
                                         in_stack_fffffffffffffb68);
                              QXmlStreamReader::raiseError((QString *)in_stack_fffffffffffffb88);
                              QString::~QString((QString *)0x1b403c);
                            }
                            else {
                              QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1b3f7a);
                              QStringView::toString((QStringView *)in_stack_fffffffffffffb70);
                              setAttributeCoordinateMode
                                        (in_stack_fffffffffffffb70,
                                         (QString *)in_stack_fffffffffffffb68);
                              QString::~QString((QString *)0x1b3fbe);
                            }
                          }
                          else {
                            QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1b3ec9);
                            QStringView::toString((QStringView *)in_stack_fffffffffffffb70);
                            setAttributeSpread(in_stack_fffffffffffffb70,
                                               (QString *)in_stack_fffffffffffffb68);
                            QString::~QString((QString *)0x1b3f0d);
                          }
                        }
                        else {
                          QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1b3e18);
                          QStringView::toString((QStringView *)in_stack_fffffffffffffb70);
                          setAttributeType(in_stack_fffffffffffffb70,
                                           (QString *)in_stack_fffffffffffffb68);
                          QString::~QString((QString *)0x1b3e5c);
                        }
                      }
                      else {
                        local_278[0] = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1b3d80);
                        dVar3 = (double)QStringView::toDouble((bool *)local_278);
                        setAttributeAngle(this,dVar3);
                      }
                    }
                    else {
                      local_240[0] = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1b3ce8);
                      dVar3 = (double)QStringView::toDouble((bool *)local_240);
                      setAttributeRadius(this,dVar3);
                    }
                  }
                  else {
                    local_208[0] = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1b3c50);
                    dVar3 = (double)QStringView::toDouble((bool *)local_208);
                    setAttributeFocalY(this,dVar3);
                  }
                }
                else {
                  local_1d0[0] = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1b3bb8);
                  dVar3 = (double)QStringView::toDouble((bool *)local_1d0);
                  setAttributeFocalX(this,dVar3);
                }
              }
              else {
                local_198[0] = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1b3b20);
                dVar3 = (double)QStringView::toDouble((bool *)local_198);
                setAttributeCentralY(this,dVar3);
              }
            }
            else {
              local_160[0] = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1b3a88);
              dVar3 = (double)QStringView::toDouble((bool *)local_160);
              setAttributeCentralX(this,dVar3);
            }
          }
          else {
            local_128[0] = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1b39f0);
            dVar3 = (double)QStringView::toDouble((bool *)local_128);
            setAttributeEndY(this,dVar3);
          }
        }
        else {
          local_f0[0] = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1b3958);
          dVar3 = (double)QStringView::toDouble((bool *)local_f0);
          setAttributeEndX(this,dVar3);
        }
      }
      else {
        local_b8[0] = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1b38c0);
        dVar3 = (double)QStringView::toDouble((bool *)local_b8);
        setAttributeStartY(this,dVar3);
      }
    }
    else {
      local_80[0] = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1b3828);
      dVar3 = (double)QStringView::toDouble((bool *)local_80);
      setAttributeStartX(this,dVar3);
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_28);
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1b405a);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001b4223;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffb88,CONCAT44(iVar2,in_stack_fffffffffffffb80));
      QStringView::QStringView<QString,_true>
                ((QStringView *)CONCAT44(iVar2,in_stack_fffffffffffffb80),
                 (QString *)in_stack_fffffffffffffb78);
      __nbytes_00 = 0;
      other.m_size._4_1_ = in_stack_fffffffffffffb94;
      other.m_size._0_4_ = in_stack_fffffffffffffb90;
      other.m_size._5_1_ = in_stack_fffffffffffffb95;
      other.m_size._6_1_ = in_stack_fffffffffffffb96;
      other.m_size._7_1_ = in_stack_fffffffffffffb97;
      other.m_data._0_1_ = in_stack_fffffffffffffb98;
      other.m_data._1_1_ = in_stack_fffffffffffffb99;
      other.m_data._2_1_ = in_stack_fffffffffffffb9a;
      other.m_data._3_1_ = in_stack_fffffffffffffb9b;
      other.m_data._4_1_ = in_stack_fffffffffffffb9c;
      other.m_data._5_1_ = in_stack_fffffffffffffb9d;
      other.m_data._6_1_ = in_stack_fffffffffffffb9e;
      other.m_data._7_1_ = in_stack_fffffffffffffb9f;
      iVar2 = QStringView::compare((QStringView *)in_stack_fffffffffffffb68,other,CaseInsensitive);
      in_stack_fffffffffffffb80 = CONCAT13(iVar2 != 0,(int3)in_stack_fffffffffffffb80) ^ 0xff000000;
      QString::~QString((QString *)0x1b412c);
      if ((in_stack_fffffffffffffb80 & 0x1000000) == 0) {
        a = size;
        Qt::Literals::StringLiterals::operator____L1((char *)in_stack_fffffffffffffb78,(size_t)size)
        ;
        ::operator+(a,(QStringView *)in_stack_fffffffffffffb68);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QLatin1String,_const_QStringView_&> *)in_stack_fffffffffffffb68);
        QXmlStreamReader::raiseError((QString *)a);
        QString::~QString((QString *)0x1b4208);
      }
      else {
        in_stack_fffffffffffffb78 = (DomGradientStop *)operator_new(0x18);
        memset(in_stack_fffffffffffffb78,0,0x18);
        DomGradientStop::DomGradientStop(in_stack_fffffffffffffb78);
        DomGradientStop::read(in_stack_fffffffffffffb78,__fd,__buf_00,__nbytes_00);
        QList<DomGradientStop_*>::append
                  ((QList<DomGradientStop_*> *)0x1b418d,in_stack_fffffffffffffb68);
      }
    }
  } while (iVar2 != 5);
LAB_001b4223:
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x1b4230);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomGradient::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"startx"_s) {
            setAttributeStartX(attribute.value().toDouble());
            continue;
        }
        if (name == u"starty"_s) {
            setAttributeStartY(attribute.value().toDouble());
            continue;
        }
        if (name == u"endx"_s) {
            setAttributeEndX(attribute.value().toDouble());
            continue;
        }
        if (name == u"endy"_s) {
            setAttributeEndY(attribute.value().toDouble());
            continue;
        }
        if (name == u"centralx"_s) {
            setAttributeCentralX(attribute.value().toDouble());
            continue;
        }
        if (name == u"centraly"_s) {
            setAttributeCentralY(attribute.value().toDouble());
            continue;
        }
        if (name == u"focalx"_s) {
            setAttributeFocalX(attribute.value().toDouble());
            continue;
        }
        if (name == u"focaly"_s) {
            setAttributeFocalY(attribute.value().toDouble());
            continue;
        }
        if (name == u"radius"_s) {
            setAttributeRadius(attribute.value().toDouble());
            continue;
        }
        if (name == u"angle"_s) {
            setAttributeAngle(attribute.value().toDouble());
            continue;
        }
        if (name == u"type"_s) {
            setAttributeType(attribute.value().toString());
            continue;
        }
        if (name == u"spread"_s) {
            setAttributeSpread(attribute.value().toString());
            continue;
        }
        if (name == u"coordinatemode"_s) {
            setAttributeCoordinateMode(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"gradientstop"_s, Qt::CaseInsensitive)) {
                auto *v = new DomGradientStop();
                v->read(reader);
                m_gradientStop.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}